

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_3a70a8::TemplateArgs::printLeft(TemplateArgs *this,OutputStream *S)

{
  StringView R;
  StringView R_00;
  StringView R_01;
  
  R.Last = "";
  R.First = "<";
  OutputStream::operator+=(S,R);
  NodeArray::printWithComma(&this->Params,S);
  if ((S->CurrentPosition != 0) && (S->Buffer[S->CurrentPosition - 1] == '>')) {
    R_00.Last = "";
    R_00.First = " ";
    OutputStream::operator+=(S,R_00);
  }
  R_01.Last = "";
  R_01.First = ">";
  OutputStream::operator+=(S,R_01);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += "<";
    Params.printWithComma(S);
    if (S.back() == '>')
      S += " ";
    S += ">";
  }